

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O3

int Cba_ObjDup(Cba_Ntk_t *pNew,Cba_Ntk_t *p,int i)

{
  uint uVar1;
  int *piVar2;
  int *piVar3;
  int x;
  
  if (i < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                  ,0x142,"Cba_ObjType_t Cba_ObjType(Cba_Ntk_t *, int)");
  }
  if (i < (p->vObjType).nSize) {
    uVar1 = i + 1;
    if (((int)uVar1 < (p->vObjFin0).nSize) && ((int)uVar1 < (p->vObjFon0).nSize)) {
      piVar2 = (p->vObjFin0).pArray;
      piVar3 = (p->vObjFon0).pArray;
      x = Cba_ObjAlloc(pNew,(uint)(byte)(p->vObjType).pArray[(uint)i],
                       piVar2[uVar1] - piVar2[(uint)i],piVar3[uVar1] - piVar3[(uint)i]);
      Cba_ObjSetCopy(p,i,x);
      return x;
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecStr.h"
                ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
}

Assistant:

static inline int Cba_ObjDup( Cba_Ntk_t * pNew, Cba_Ntk_t * p, int i )
{
    int iObj = Cba_ObjAlloc( pNew, Cba_ObjType(p, i), Cba_ObjFinNum(p, i), Cba_ObjFonNum(p, i) );
    Cba_ObjSetCopy( p, i, iObj );
    return iObj;
}